

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O1

bool QTest::invokeTestMethodIfValid(QMetaMethod m,QObject *obj)

{
  undefined1 uVar1;
  long in_FS_OFFSET;
  void *local_28;
  char *pcStack_20;
  QMetaTypeInterface *local_18 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (m.mobj == (QMetaObject *)0x0) {
    uVar1 = 0;
  }
  else {
    local_28 = (void *)0x0;
    pcStack_20 = (char *)0x0;
    local_18[0] = (QMetaTypeInterface *)0x0;
    uVar1 = QMetaMethod::invokeImpl(m,obj,DirectConnection,1,&local_28,&pcStack_20,local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool invokeTestMethodIfValid(QMetaMethod m, QObject *obj = QTest::currentTestObject)
{
    if (!m.isValid())
        return false;
    bool ok = true;
    try { ok = m.invoke(obj, Qt ::DirectConnection); }
    catch (const TestFailedException &) {}  // ignore (used for control flow)
    catch (const TestSkippedException &) {} // ditto
    // every other exception is someone else's problem
    return ok;
}